

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_finite.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  invalid_argument *this;
  double __value;
  finite solver;
  double s;
  double e;
  double f;
  options opt;
  double *local_60;
  double *local_58;
  double *local_50;
  tuple<double,_double,_double> local_48;
  
  options::options(&opt,argc,argv);
  if (opt.valid == false) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," L T\n");
    poVar2 = std::operator<<(poVar2,"       ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," L Tmin Tmax dT\n");
    return 0x7f;
  }
  if (opt.Tmax < opt.Tmin) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
  }
  else {
    if (0.0 < opt.dT) {
      poVar2 = std::operator<<((ostream *)&std::cout,"# L = ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      afh::free_energy::chain::finite::finite(&solver,__value);
      lVar1 = std::cout;
      *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar1 + -0x18)) = 0xb;
      std::operator<<((ostream *)&std::cout,"# ground state energy/L: ");
      poVar2 = std::ostream::_M_insert<double>
                         (*solver.eigenvalues_.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data / (((double)CONCAT44(0x45300000,(int)(solver.L_ >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)solver.L_) -
                                    4503599627370496.0)));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&std::cout,"# first excitation gap: ");
      poVar2 = std::ostream::_M_insert<double>
                         (solver.eigenvalues_.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data[1] -
                          *solver.eigenvalues_.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&std::cout,"# [T] [free energy/L] [energy/L] [entropy/L]\n");
      for (; opt.Tmin < opt.dT * 0.0001 + opt.Tmax; opt.Tmin = opt.Tmin + opt.dT) {
        afh::free_energy::chain::finite::free_energy(&local_48,&solver,opt.Tmin);
        local_60 = &s;
        local_58 = &e;
        local_50 = &f;
        std::tuple<double&,double&,double&>::operator=
                  ((tuple<double&,double&,double&> *)&local_60,&local_48);
        poVar2 = std::ostream::_M_insert<double>(opt.Tmin);
        std::operator<<(poVar2,' ');
        poVar2 = std::ostream::_M_insert<double>(f);
        std::operator<<(poVar2,' ');
        poVar2 = std::ostream::_M_insert<double>(e);
        std::operator<<(poVar2,' ');
        poVar2 = std::ostream::_M_insert<double>(s);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      free(solver.eigenvalues_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      return 0;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"dT should be positive");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main(int argc, char** argv) {
  options opt(argc, argv);
  if (!opt.valid) {
    std::cerr << "Usage: " << argv[0] << " L T\n"
              << "       " << argv[0] << " L Tmin Tmax dT\n";
    return 127;
  }
  if (opt.Tmin > opt.Tmax) throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (opt.dT <= 0) throw(std::invalid_argument("dT should be positive"));
  std::cout << "# L = " << opt.L << std::endl;

  afh::free_energy::chain::finite solver(opt.L);
  std::cout << std::scientific << std::setprecision(11);
  std::cout << "# ground state energy/L: " << solver.gs_energy() << std::endl;
  std::cout << "# first excitation gap: " << solver.gap() << std::endl;

  std::cout << "# [T] [free energy/L] [energy/L] [entropy/L]\n";
  for (auto t = opt.Tmin; t < opt.Tmax + 1e-4 * opt.dT; t += opt.dT) {
    double f, e, s;
    std::tie(f, e, s) = solver.free_energy(t);
    std::cout << t << ' ' << f << ' ' << e << ' ' << s << std::endl;
  }
}